

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix.cc
# Opt level: O0

ColMatrix * __thiscall fizplex::ColMatrix::operator=(ColMatrix *this,ColMatrix *rhs)

{
  vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *in_RSI;
  ColMatrix *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffd8;
  value_type *__x;
  
  in_RDI->m = (size_t)in_RSI[1].
                      super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  in_RDI->n = (size_t)in_RSI[1].
                      super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::clear
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)0x1e1a07);
  for (__x = (value_type *)0x0; __x < (value_type *)in_RDI->n;
      __x = (value_type *)
            ((long)&(__x->values).
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1)) {
    column(in_RDI,in_stack_ffffffffffffffd8);
    std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::push_back(in_RSI,__x);
  }
  return in_RDI;
}

Assistant:

ColMatrix &ColMatrix::operator=(const ColMatrix &rhs) {
  m = rhs.m;
  n = rhs.n;
  cols.clear();
  for (size_t i = 0; i < n; i++)
    cols.push_back(rhs.column(i));
  return *this;
}